

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

bool __thiscall
duckdb::BitpackingState<duckdb::uhugeint_t,_duckdb::hugeint_t>::
Update<duckdb::EmptyBitpackingWriter>
          (BitpackingState<duckdb::uhugeint_t,_duckdb::hugeint_t> *this,uhugeint_t value,
          bool is_valid)

{
  uhugeint_t *puVar1;
  uhugeint_t b;
  uhugeint_t a;
  uhugeint_t a_00;
  bool bVar2;
  uint64_t in_RAX;
  idx_t iVar3;
  uint64_t unaff_RBX;
  uint64_t unaff_R14;
  uint64_t unaff_R15;
  uhugeint_t uVar4;
  
  iVar3 = this->compression_buffer_idx;
  this->compression_buffer_validity[iVar3] = is_valid;
  this->all_valid = (bool)(this->all_valid & is_valid);
  this->all_invalid = (bool)(this->all_invalid & !is_valid);
  if (is_valid) {
    puVar1 = this->compression_buffer;
    puVar1[iVar3].lower = value.lower;
    puVar1[iVar3].upper = value.upper;
    a.upper = unaff_R15;
    a.lower = unaff_R14;
    uVar4.upper = unaff_RBX;
    uVar4.lower = in_RAX;
    uVar4 = MinValue<duckdb::uhugeint_t>(a,uVar4);
    this->minimum = uVar4;
    a_00.upper = unaff_R15;
    a_00.lower = unaff_R14;
    b.upper = unaff_RBX;
    b.lower = in_RAX;
    uVar4 = MaxValue<duckdb::uhugeint_t>(a_00,b);
    this->maximum = uVar4;
    iVar3 = this->compression_buffer_idx;
  }
  this->compression_buffer_idx = iVar3 + 1;
  if (iVar3 + 1 == 0x800) {
    bVar2 = Flush<duckdb::EmptyBitpackingWriter>(this);
    Reset(this);
  }
  else {
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool Update(T value, bool is_valid) {
		compression_buffer_validity[compression_buffer_idx] = is_valid;
		all_valid = all_valid && is_valid;
		all_invalid = all_invalid && !is_valid;

		if (is_valid) {
			compression_buffer[compression_buffer_idx] = value;
			minimum = MinValue<T>(minimum, value);
			maximum = MaxValue<T>(maximum, value);
		}

		compression_buffer_idx++;

		if (compression_buffer_idx == BITPACKING_METADATA_GROUP_SIZE) {
			bool success = Flush<OP>();
			Reset();
			return success;
		}
		return true;
	}